

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPlotIO.cpp
# Opt level: O0

void __thiscall NaDPlotFile::SetTitle(NaDPlotFile *this,char *szTitle,int iTitleNo)

{
  undefined4 *puVar1;
  size_t sVar2;
  void *pvVar3;
  int in_EDX;
  char *in_RSI;
  long in_RDI;
  
  if ((-1 < in_EDX) && (in_EDX < 3)) {
    if (in_RSI == (char *)0x0) {
      puVar1 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar1 = 0;
      __cxa_throw(puVar1,&NaException::typeinfo,0);
    }
    pvVar3 = *(void **)(in_RDI + 0x70 + (long)in_EDX * 8);
    if (pvVar3 != (void *)0x0) {
      operator_delete__(pvVar3);
    }
    sVar2 = strlen(in_RSI);
    pvVar3 = operator_new__(sVar2 + 1);
    *(void **)(in_RDI + 0x70 + (long)in_EDX * 8) = pvVar3;
    strcpy(*(char **)(in_RDI + 0x70 + (long)in_EDX * 8),in_RSI);
  }
  return;
}

Assistant:

void    NaDPlotFile::SetTitle (const char* szTitle, int iTitleNo)
{
    if(iTitleNo < 0 || iTitleNo >= NaDPLOT_TITLE_NUM)
        // Not so many titles are supported
        return;

    if(NULL == szTitle)
        throw(na_null_pointer);

    delete[] szTitles[iTitleNo];
    szTitles[iTitleNo] = new char[1 + strlen(szTitle)];
    strcpy(szTitles[iTitleNo], szTitle);
}